

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int ncnn::convolution(Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
                     int kernel_h,int stride_w,int stride_h,int dilation_w,int dilation_h,
                     int activation_type,Mat *activation_params,Option *opt)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_f9;
  void *local_f8;
  ulong local_f0;
  ulong local_e8;
  ulong local_e0;
  float *local_d8;
  Mat *local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  long local_b0;
  void *local_a8;
  long local_a0;
  Mat *local_98;
  Mat *local_90;
  long local_88;
  ulong local_80;
  void *local_78;
  long local_70;
  long local_68;
  long local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  iVar4 = bottom_blob->w;
  if (bias_data->data == (void *)0x0) {
    bVar17 = true;
  }
  else {
    bVar17 = (long)bias_data->c * bias_data->cstep == 0;
  }
  local_f8 = (void *)CONCAT44(local_f8._4_4_,bottom_blob->c);
  local_c8 = (ulong)top_blob->w;
  local_e0 = (ulong)(uint)top_blob->h;
  local_f0 = (ulong)(uint)top_blob->c;
  uVar2 = kernel_h * kernel_w;
  local_d0 = top_blob;
  local_98 = weight_data;
  local_90 = bias_data;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)(int)uVar2,&local_f9);
  iVar3 = 0;
  iVar5 = 0;
  if (0 < kernel_w) {
    iVar5 = kernel_w;
  }
  iVar7 = 0;
  if (0 < kernel_h) {
    iVar7 = kernel_h;
  }
  iVar9 = iVar5;
  iVar12 = 0;
  for (iVar11 = 0; iVar11 != iVar7; iVar11 = iVar11 + 1) {
    for (lVar14 = (long)iVar12; iVar9 != lVar14; lVar14 = lVar14 + 1) {
      local_48._M_impl.super__Vector_impl_data._M_start[lVar14] = iVar3;
      iVar3 = iVar3 + dilation_w;
    }
    iVar3 = iVar3 + (iVar4 * dilation_h - dilation_w * kernel_w);
    iVar9 = iVar9 + iVar5;
    iVar12 = iVar5 + iVar12;
  }
  local_a8 = local_d0->data;
  local_b0 = local_d0->cstep * local_d0->elemsize;
  uVar16 = 0;
  if (0 < (int)uVar2) {
    uVar16 = (ulong)uVar2;
  }
  uVar8 = 0;
  if (0 < (int)local_f8) {
    uVar8 = (ulong)local_f8 & 0xffffffff;
  }
  local_d0 = (Mat *)0x0;
  if (0 < (int)local_c8) {
    local_d0 = (Mat *)(local_c8 & 0xffffffff);
  }
  local_70 = (long)stride_w;
  iVar4 = (int)local_e0;
  local_e0 = local_e0 & 0xffffffff;
  if (iVar4 < 1) {
    local_e0 = 0;
  }
  local_a0 = (long)stride_h;
  iVar4 = (int)local_f0;
  local_e8 = 0;
  local_f0 = local_f0 & 0xffffffff;
  if (iVar4 < 1) {
    local_f0 = 0;
  }
  iVar4 = kernel_h * (int)local_f8;
  uVar15 = (ulong)(activation_type - 1);
  uVar6 = 0;
  local_c0 = uVar15;
  while (uVar6 != local_f0) {
    local_88 = (long)(int)local_e8 << 2;
    local_f8 = (void *)(local_b0 * uVar6 + (long)local_a8);
    uVar10 = 0;
    local_b8 = uVar6;
    while (uVar10 != local_e0) {
      local_78 = local_90->data;
      local_60 = uVar10 * local_a0;
      local_d8 = (float *)activation_params->data;
      local_68 = (long)local_98->data + local_88;
      local_80 = uVar10;
      for (uVar6 = 0; (Mat *)uVar6 != local_d0; uVar6 = uVar6 + 1) {
        fVar20 = 0.0;
        if (!bVar17) {
          fVar20 = *(float *)((long)local_78 + local_b8 * 4);
        }
        lVar14 = local_68;
        for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
          for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
            fVar20 = fVar20 + *(float *)(lVar14 + uVar13 * 4) *
                              *(float *)((long)bottom_blob->data +
                                        (long)local_48._M_impl.super__Vector_impl_data._M_start
                                              [uVar13] * 4 +
                                        bottom_blob->cstep * bottom_blob->elemsize * uVar10 +
                                        uVar6 * local_70 * 4 +
                                        bottom_blob->w * local_60 * bottom_blob->elemsize);
          }
          lVar14 = lVar14 + (long)(int)uVar2 * 4;
        }
        fVar18 = fVar20;
        if ((uint)uVar15 < 6) {
          switch((long)&switchD_00187ca0::switchdataD_004c54c4 +
                 (long)(int)(&switchD_00187ca0::switchdataD_004c54c4)[uVar15]) {
          case 0x187ca2:
            if (fVar20 <= 0.0) {
              fVar18 = 0.0;
            }
            break;
          case 0x187cb2:
            uStack_54 = 0;
            uStack_50 = 0;
            uStack_4c = 0;
            local_58 = fVar20;
            fVar20 = expf(fVar20);
            fVar20 = logf(fVar20 + 1.0);
            fVar20 = tanhf(fVar20);
            uVar15 = local_c0;
            fVar18 = fVar20 * local_58;
            break;
          case 0x187cec:
            if (fVar20 <= *local_d8) {
              fVar20 = *local_d8;
            }
            fVar18 = local_d8[1];
            if (fVar20 <= local_d8[1]) {
              fVar18 = fVar20;
            }
            break;
          case 0x187d0b:
            if (88.37626 <= fVar20) {
              fVar20 = 88.37626;
            }
            fVar20 = expf((float)(-(uint)(fVar20 < -88.37626) & 0x42b0c0a5 |
                                 ~-(uint)(fVar20 < -88.37626) & (uint)-fVar20));
            uVar15 = local_c0;
            fVar18 = 1.0 / (fVar20 + 1.0);
            break;
          case 0x187d5d:
            fVar18 = (float)(~-(uint)(0.0 < fVar20) & (uint)*local_d8 |
                            -(uint)(0.0 < fVar20) & 0x3f800000) * fVar20;
            break;
          case 0x187d88:
            fVar1 = *local_d8;
            fVar19 = -local_d8[1] / fVar1;
            fVar18 = 0.0;
            if ((fVar19 <= fVar20) && (fVar18 = fVar20, fVar20 <= fVar19 + 1.0 / fVar1)) {
              fVar18 = (fVar1 * fVar20 + local_d8[1]) * fVar20;
            }
          }
        }
        *(float *)((long)local_f8 + uVar6 * 4) = fVar18;
      }
      local_f8 = (void *)((long)local_f8 + local_c8 * 4);
      uVar10 = local_80 + 1;
    }
    local_e8 = (ulong)(uint)((int)local_e8 + iVar4 * kernel_w);
    uVar6 = local_b8 + 1;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return extraout_EAX;
}

Assistant:

static int convolution(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int stride_w, int stride_h, int dilation_w, int dilation_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int w = bottom_blob.w;
    const int inch = bottom_blob.c;

    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int bias_term = bias_data.empty() ? 0 : 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * inch * p;

                for (int q = 0; q < inch; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[space_ofs[k]]; // 20.72
                        float wt = kptr[k];
                        sum += val * wt; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = activation_ss(sum, activation_type, activation_params);
            }

            outptr += outw;
        }
    }

    return 0;
}